

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O2

string * __thiscall
backend::codegen::format_load_pc_label_abi_cxx11_
          (string *__return_storage_ptr__,codegen *this,string_view function_name,uint32_t label_id)

{
  ostream *poVar1;
  stringstream s;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::operator<<(local_198,".ld_pc_");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)function_name._M_len,(long)this);
  poVar1 = std::operator<<(poVar1,"$");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_load_pc_label(std::string_view function_name,
                                        uint32_t label_id) {
  auto s = std::stringstream();
  s << ".ld_pc_" << function_name << "$" << label_id;
  return s.str();
}